

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qoffscreenintegration_x11.cpp
# Opt level: O0

QOffscreenX11PlatformNativeInterface * __thiscall
QOffscreenX11Integration::nativeInterface(QOffscreenX11Integration *this)

{
  bool bVar1;
  QPlatformNativeInterface *other;
  QOffscreenX11PlatformNativeInterface *pQVar2;
  long in_RDI;
  QOffscreenIntegration *in_stack_ffffffffffffffd8;
  
  bVar1 = QScopedPointer<QPlatformNativeInterface,_QScopedPointerDeleter<QPlatformNativeInterface>_>
          ::operator!((QScopedPointer<QPlatformNativeInterface,_QScopedPointerDeleter<QPlatformNativeInterface>_>
                       *)(in_RDI + 0x28));
  if (bVar1) {
    pQVar2 = (QOffscreenX11PlatformNativeInterface *)(in_RDI + 0x28);
    other = (QPlatformNativeInterface *)operator_new(0x28);
    QOffscreenX11PlatformNativeInterface::QOffscreenX11PlatformNativeInterface
              (pQVar2,in_stack_ffffffffffffffd8);
    QScopedPointer<QPlatformNativeInterface,_QScopedPointerDeleter<QPlatformNativeInterface>_>::
    reset((QScopedPointer<QPlatformNativeInterface,_QScopedPointerDeleter<QPlatformNativeInterface>_>
           *)pQVar2,other);
  }
  pQVar2 = (QOffscreenX11PlatformNativeInterface *)
           QScopedPointer<QPlatformNativeInterface,_QScopedPointerDeleter<QPlatformNativeInterface>_>
           ::data((QScopedPointer<QPlatformNativeInterface,_QScopedPointerDeleter<QPlatformNativeInterface>_>
                   *)(in_RDI + 0x28));
  return pQVar2;
}

Assistant:

QOffscreenX11PlatformNativeInterface *QOffscreenX11Integration::nativeInterface() const
{
   if (!m_nativeInterface)
       m_nativeInterface.reset(new QOffscreenX11PlatformNativeInterface(const_cast<QOffscreenX11Integration *>(this)));
   return static_cast<QOffscreenX11PlatformNativeInterface *>(m_nativeInterface.data());
}